

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O0

void __thiscall DBot::WhatToGet(DBot *this,AActor *item)

{
  APlayerPawn *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  AAmmo *pAVar5;
  MetaClass *type;
  AInventory *p;
  AAmmo *pAVar6;
  PClass *pPVar7;
  AActor *pAVar8;
  bool bVar9;
  byte local_59;
  TFlags<ActorFlag,_unsigned_int> local_44;
  AInventory *local_40;
  AInventory *holdingammo;
  PClassActor *parent;
  AAmmo *ammo;
  AWeapon *heldWeapon;
  int weapgiveammo;
  AActor *item_local;
  DBot *this_local;
  
  _weapgiveammo = (AAmmo *)item;
  item_local = (AActor *)this;
  TFlags<ActorRenderFlag,_unsigned_int>::operator&
            ((TFlags<ActorRenderFlag,_unsigned_int> *)((long)&heldWeapon + 4),(int)item + 0x10c);
  uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&heldWeapon + 4));
  pAVar6 = _weapgiveammo;
  bVar9 = true;
  if (uVar2 == 0) {
    pAVar5 = (AAmmo *)::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->prev);
    bVar9 = pAVar6 == pAVar5;
  }
  if (bVar9) {
    return;
  }
  bVar9 = FBoolCVar::operator_cast_to_bool(&alwaysapplydmflags);
  if (bVar9) {
LAB_00439ac4:
    uVar2 = FIntCVar::operator_cast_to_int(&dmflags);
    local_59 = (uVar2 & 4) != 0 ^ 0xff;
  }
  else {
    iVar3 = FIntCVar::operator_cast_to_int(&deathmatch);
    local_59 = 0;
    if (iVar3 != 0) goto LAB_00439ac4;
  }
  heldWeapon._0_4_ = (uint)(local_59 & 1);
  bVar9 = DObject::IsKindOf((DObject *)_weapgiveammo,AWeapon::RegistrationInfo.MyClass);
  if (bVar9) {
    this_00 = this->player->mo;
    type = AActor::GetClass((AActor *)_weapgiveammo);
    p = AActor::FindInventory(&this_00->super_AActor,type,false);
    ammo = (AAmmo *)dyn_cast<AWeapon>((DObject *)p);
    if ((AWeapon *)ammo != (AWeapon *)0x0) {
      if ((uint)heldWeapon == 0) {
        return;
      }
      bVar9 = TObjPtr<AAmmo>::operator==(&((AWeapon *)ammo)->Ammo1,(AAmmo *)0x0);
      if (!bVar9) {
        pAVar6 = TObjPtr<AAmmo>::operator->
                           ((TObjPtr<AAmmo> *)&ammo[1].super_AInventory.super_AActor.SpriteAngle);
        iVar3 = (pAVar6->super_AInventory).Amount;
        pAVar6 = TObjPtr<AAmmo>::operator->
                           ((TObjPtr<AAmmo> *)&ammo[1].super_AInventory.super_AActor.SpriteAngle);
        if (iVar3 < (pAVar6->super_AInventory).MaxAmount) goto LAB_00439d5d;
      }
      bVar9 = TObjPtr<AAmmo>::operator==
                        ((TObjPtr<AAmmo> *)&ammo[1].super_AInventory.super_AActor.SpriteRotation,
                         (AAmmo *)0x0);
      if (bVar9) {
        return;
      }
      pAVar6 = TObjPtr<AAmmo>::operator->
                         ((TObjPtr<AAmmo> *)&ammo[1].super_AInventory.super_AActor.SpriteRotation);
      iVar3 = (pAVar6->super_AInventory).Amount;
      pAVar6 = TObjPtr<AAmmo>::operator->
                         ((TObjPtr<AAmmo> *)&ammo[1].super_AInventory.super_AActor.SpriteRotation);
      if ((pAVar6->super_AInventory).MaxAmount <= iVar3) {
        return;
      }
    }
    goto LAB_00439d5d;
  }
  bVar9 = DObject::IsKindOf((DObject *)_weapgiveammo,AAmmo::RegistrationInfo.MyClass);
  pAVar6 = _weapgiveammo;
  if (bVar9) {
    parent = (PClassActor *)_weapgiveammo;
    holdingammo = (AInventory *)AAmmo::GetParentAmmo(_weapgiveammo);
    local_40 = AActor::FindInventory
                         (&this->player->mo->super_AActor,(PClassActor *)holdingammo,false);
    if ((local_40 != (AInventory *)0x0) && (local_40->MaxAmount <= local_40->Amount)) {
      return;
    }
    goto LAB_00439d5d;
  }
  pPVar7 = PClass::FindClass("Megasphere");
  bVar9 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
  pAVar6 = _weapgiveammo;
  if (bVar9) {
LAB_00439cd7:
    if (deh.MaxSoulsphere <= (this->player->mo->super_AActor).health) {
      return;
    }
  }
  else {
    pPVar7 = PClass::FindClass("Soulsphere");
    bVar9 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
    pAVar6 = _weapgiveammo;
    if (bVar9) goto LAB_00439cd7;
    pPVar7 = PClass::FindClass("HealthBonus");
    bVar9 = DObject::IsKindOf((DObject *)pAVar6,pPVar7);
    if (bVar9) goto LAB_00439cd7;
  }
  bVar9 = DObject::IsKindOf((DObject *)_weapgiveammo,AHealth::RegistrationInfo.MyClass);
  if ((bVar9) &&
     (iVar3 = (this->player->mo->super_AActor).health,
     iVar4 = APlayerPawn::GetMaxHealth(this->player->mo),
     iVar4 + (this->player->mo->super_AActor).stamina <= iVar3)) {
    return;
  }
LAB_00439d5d:
  bVar1 = TObjPtr<AActor>::operator==(&this->dest,(AActor *)0x0);
  bVar9 = true;
  if (!bVar1) {
    pAVar8 = TObjPtr<AActor>::operator->(&this->dest);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_44,
               (int)pAVar8 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
    bVar9 = uVar2 == 0;
  }
  if (bVar9) {
    (this->prev).field_0 = (this->dest).field_0;
    TObjPtr<AActor>::operator=(&this->dest,(AActor *)_weapgiveammo);
    this->t_roam = 0x8c;
  }
  return;
}

Assistant:

void DBot::WhatToGet (AActor *item)
{
#define typeis(x) item->IsKindOf (PClass::FindClass (#x))
	if ((item->renderflags & RF_INVISIBLE) //Under respawn and away.
		|| item == prev)
	{
		return;
	}
	int weapgiveammo = (alwaysapplydmflags || deathmatch) && !(dmflags & DF_WEAPONS_STAY);

	//if(pos && !bglobal.thingvis[pos->id][item->id]) continue;
//	if (item->IsKindOf (RUNTIME_CLASS(AArtifact)))
//		return;	// don't know how to use artifacts
	if (item->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// FIXME
		AWeapon *heldWeapon;

		heldWeapon = dyn_cast<AWeapon>(player->mo->FindInventory(item->GetClass()));
		if (heldWeapon != NULL)
		{
			if (!weapgiveammo)
				return;
			if ((heldWeapon->Ammo1 == NULL || heldWeapon->Ammo1->Amount >= heldWeapon->Ammo1->MaxAmount) &&
				(heldWeapon->Ammo2 == NULL || heldWeapon->Ammo2->Amount >= heldWeapon->Ammo2->MaxAmount))
			{
				return;
			}
		}
	}
	else if (item->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		AAmmo *ammo = static_cast<AAmmo *> (item);
		PClassActor *parent = ammo->GetParentAmmo ();
		AInventory *holdingammo = player->mo->FindInventory (parent);

		if (holdingammo != NULL && holdingammo->Amount >= holdingammo->MaxAmount)
		{
			return;
		}
	}
	else if ((typeis (Megasphere) || typeis (Soulsphere) || typeis (HealthBonus)) && player->mo->health >= deh.MaxSoulsphere)
		return;
	else if (item->IsKindOf (RUNTIME_CLASS(AHealth)) && player->mo->health >= player->mo->GetMaxHealth() + player->mo->stamina)
		return;

	if ((dest == NULL ||
		!(dest->flags & MF_SPECIAL)/* ||
		!Reachable (dest)*/)/* &&
		Reachable (item)*/)	// Calling Reachable slows this down tremendously
	{
		prev = dest;
		dest = item;
		t_roam = MAXROAM;
	}
}